

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

float deqp::gles3::Functional::getEpsFromMaxUlpDiff(float value,deUint32 ulpDiff)

{
  int exponent;
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  Float<unsigned_int,_8,_23,_127,_3U> local_14;
  
  exponent = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_14);
  FVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,exponent,ulpDiff | 0x800000);
  return (float)FVar1.m_value - (float)(exponent * 0x800000 + 0x3f800000);
}

Assistant:

inline float getEpsFromMaxUlpDiff (float value, deUint32 ulpDiff)
{
	const int exp = tcu::Float32(value).exponent();
	return tcu::Float32::construct(+1, exp, (1u<<23) | ulpDiff).asFloat() - tcu::Float32::construct(+1, exp, 1u<<23).asFloat();
}